

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

void Abc_NtkBalanceLevel(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = Abc_NtkObj(pNtk,iVar2);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      *(uint *)&pAVar1->field_0x14 = *(uint *)&pAVar1->field_0x14 & 0xfff;
    }
  }
  for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,iVar2);
    Abc_NtkBalanceLevel_rec((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
  }
  return;
}

Assistant:

void Abc_NtkBalanceLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->Level = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkBalanceLevel_rec( Abc_ObjFanin0(pNode) );
}